

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_mnist.cpp
# Opt level: O0

void printStats(Net *net,LabeledDataset *testSet,IntClassifier *metrics)

{
  _Setprecision _Var1;
  ostream *poVar2;
  void *this;
  float fVar3;
  double dVar4;
  undefined1 local_50 [8];
  ConfusionMatrix<int,_1> cm;
  IntClassifier *metrics_local;
  LabeledDataset *testSet_local;
  Net *net_local;
  
  cm.cm._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)metrics;
  (*(metrics->super_AClassifier<int,_1>)._vptr_AClassifier[2])(local_50,metrics,testSet);
  poVar2 = std::operator<<((ostream *)&std::cout,"E = ");
  _Var1 = notch::core::std::setprecision(6);
  poVar2 = std::operator<<(poVar2,_Var1);
  fVar3 = meanLossEstimate(net,testSet,0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar3);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"PPV = ");
  _Var1 = notch::core::std::setprecision(3);
  poVar2 = std::operator<<(poVar2,_Var1);
  dVar4 = notch::metrics::ConfusionMatrix<int,_1>::precision((ConfusionMatrix<int,_1> *)local_50);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"TPR = ");
  _Var1 = notch::core::std::setprecision(3);
  poVar2 = std::operator<<(poVar2,_Var1);
  dVar4 = notch::metrics::ConfusionMatrix<int,_1>::recall((ConfusionMatrix<int,_1> *)local_50);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"ACC = ");
  _Var1 = notch::core::std::setprecision(3);
  poVar2 = std::operator<<(poVar2,_Var1);
  dVar4 = notch::metrics::ConfusionMatrix<int,_1>::accuracy((ConfusionMatrix<int,_1> *)local_50);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"F1 = ");
  _Var1 = notch::core::std::setprecision(3);
  poVar2 = std::operator<<(poVar2,_Var1);
  dVar4 = notch::metrics::ConfusionMatrix<int,_1>::F1score((ConfusionMatrix<int,_1> *)local_50);
  this = (void *)std::ostream::operator<<(poVar2,dVar4);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  notch::metrics::ConfusionMatrix<int,_1>::~ConfusionMatrix((ConfusionMatrix<int,_1> *)local_50);
  return;
}

Assistant:

void printStats(Net &net, LabeledDataset &testSet, IntClassifier &metrics) {
    auto cm = metrics.test(testSet);
    cout << "E = "
        << setprecision(6)
        << meanLossEstimate(net, testSet) << " "
        << "PPV = "
        << setprecision(3)
        << cm.precision() << " "
        << "TPR = "
        << setprecision(3)
        << cm.recall() << " "
        << "ACC = "
        << setprecision(3)
        << cm.accuracy() << " "
        << "F1 = "
        << setprecision(3)
        << cm.F1score() << endl;
}